

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O3

void write_lore_entries(ang_file *fff)

{
  monster_group_role mVar1;
  undefined8 *puVar2;
  monster_blow *pmVar3;
  object_kind *poVar4;
  char *pcVar5;
  angband_constants *paVar6;
  monster_lore *pmVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  monster_mimic *m;
  ulong uVar11;
  monster_drop *pmVar12;
  monster_mimic *pmVar13;
  monster_race *pmVar14;
  monster_friends *f;
  long lVar15;
  monster_friends *pmVar16;
  monster_friends_base *pmVar17;
  char name [120];
  char *in_stack_ffffffffffffff28;
  undefined4 uVar18;
  char local_a8 [120];
  
  if (z_info->r_max != 0) {
    uVar10 = 0;
    paVar6 = z_info;
    pmVar7 = l_list;
    pmVar14 = r_info;
    do {
      uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if ((pmVar14[uVar10].name != (char *)0x0) &&
         ((pmVar7[uVar10].sights != 0 || (pmVar7[uVar10].all_known == true)))) {
        file_putf(fff,"name:%s\n");
        if (pmVar7[uVar10].all_known == true) {
          file_putf(fff,"base:%s\n",(pmVar14[uVar10].base)->name);
        }
        uVar9 = (uint)pmVar7[uVar10].cast_spell;
        uVar8 = (uint)pmVar7[uVar10].cast_innate;
        in_stack_ffffffffffffff28 = (char *)CONCAT44(uVar18,(uint)pmVar7[uVar10].ignore);
        file_putf(fff,"counts:%d:%d:%d:%d:%d:%d:%d\n",(ulong)pmVar7[uVar10].sights,
                  (ulong)pmVar7[uVar10].deaths,(ulong)pmVar7[uVar10].tkills,
                  (ulong)pmVar7[uVar10].wake,in_stack_ffffffffffffff28,uVar8,uVar9);
        if (z_info->mon_blows_max != 0) {
          lVar15 = 0;
          uVar11 = 0;
          paVar6 = z_info;
          do {
            if (((pmVar7[uVar10].blow_known[uVar11] != false) || (pmVar7[uVar10].all_known == true))
               && (puVar2 = *(undefined8 **)((long)&(pmVar7[uVar10].blows)->method + lVar15),
                  puVar2 != (undefined8 *)0x0)) {
              file_putf(fff,"blow:%s",*puVar2);
              file_putf(fff,":%s",**(undefined8 **)((long)&(pmVar7[uVar10].blows)->effect + lVar15))
              ;
              pmVar3 = pmVar7[uVar10].blows;
              file_putf(fff,":%d+%dd%dM%d",(ulong)*(uint *)((long)&(pmVar3->dice).base + lVar15),
                        (ulong)*(uint *)((long)&(pmVar3->dice).dice + lVar15),
                        (ulong)*(uint *)((long)&(pmVar3->dice).sides + lVar15),
                        (ulong)*(uint *)((long)&(pmVar3->dice).m_bonus + lVar15),
                        in_stack_ffffffffffffff28,uVar8,uVar9);
              file_putf(fff,":%d",
                        (ulong)*(uint *)((long)&(pmVar7[uVar10].blows)->times_seen + lVar15));
              file_putf(fff,":%d",uVar11 & 0xffffffff);
              file_putf(fff,"\n");
              paVar6 = z_info;
            }
            uVar11 = uVar11 + 1;
            lVar15 = lVar15 + 0x30;
          } while (uVar11 < paVar6->mon_blows_max);
        }
        write_flags(fff,"flags:",pmVar7[uVar10].flags,0xb,r_info_flags);
        flag_inter(pmVar7[uVar10].spell_flags,pmVar14[uVar10].spell_flags,0xc);
        write_flags(fff,"spells:",pmVar7[uVar10].spell_flags,0xc,r_info_spell_flags);
        pmVar12 = pmVar7[uVar10].drops;
        if (pmVar12 != (monster_drop *)0x0) {
          poVar4 = pmVar12->kind;
          local_a8[0x60] = '\0';
          local_a8[0x61] = '\0';
          local_a8[0x62] = '\0';
          local_a8[99] = '\0';
          local_a8[100] = '\0';
          local_a8[0x65] = '\0';
          local_a8[0x66] = '\0';
          local_a8[0x67] = '\0';
          local_a8[0x68] = '\0';
          local_a8[0x69] = '\0';
          local_a8[0x6a] = '\0';
          local_a8[0x6b] = '\0';
          local_a8[0x6c] = '\0';
          local_a8[0x6d] = '\0';
          local_a8[0x6e] = '\0';
          local_a8[0x6f] = '\0';
          local_a8[0x50] = '\0';
          local_a8[0x51] = '\0';
          local_a8[0x52] = '\0';
          local_a8[0x53] = '\0';
          local_a8[0x54] = '\0';
          local_a8[0x55] = '\0';
          local_a8[0x56] = '\0';
          local_a8[0x57] = '\0';
          local_a8[0x58] = '\0';
          local_a8[0x59] = '\0';
          local_a8[0x5a] = '\0';
          local_a8[0x5b] = '\0';
          local_a8[0x5c] = '\0';
          local_a8[0x5d] = '\0';
          local_a8[0x5e] = '\0';
          local_a8[0x5f] = '\0';
          local_a8[0x40] = '\0';
          local_a8[0x41] = '\0';
          local_a8[0x42] = '\0';
          local_a8[0x43] = '\0';
          local_a8[0x44] = '\0';
          local_a8[0x45] = '\0';
          local_a8[0x46] = '\0';
          local_a8[0x47] = '\0';
          local_a8[0x48] = '\0';
          local_a8[0x49] = '\0';
          local_a8[0x4a] = '\0';
          local_a8[0x4b] = '\0';
          local_a8[0x4c] = '\0';
          local_a8[0x4d] = '\0';
          local_a8[0x4e] = '\0';
          local_a8[0x4f] = '\0';
          local_a8[0x30] = '\0';
          local_a8[0x31] = '\0';
          local_a8[0x32] = '\0';
          local_a8[0x33] = '\0';
          local_a8[0x34] = '\0';
          local_a8[0x35] = '\0';
          local_a8[0x36] = '\0';
          local_a8[0x37] = '\0';
          local_a8[0x38] = '\0';
          local_a8[0x39] = '\0';
          local_a8[0x3a] = '\0';
          local_a8[0x3b] = '\0';
          local_a8[0x3c] = '\0';
          local_a8[0x3d] = '\0';
          local_a8[0x3e] = '\0';
          local_a8[0x3f] = '\0';
          local_a8[0x20] = '\0';
          local_a8[0x21] = '\0';
          local_a8[0x22] = '\0';
          local_a8[0x23] = '\0';
          local_a8[0x24] = '\0';
          local_a8[0x25] = '\0';
          local_a8[0x26] = '\0';
          local_a8[0x27] = '\0';
          local_a8[0x28] = '\0';
          local_a8[0x29] = '\0';
          local_a8[0x2a] = '\0';
          local_a8[0x2b] = '\0';
          local_a8[0x2c] = '\0';
          local_a8[0x2d] = '\0';
          local_a8[0x2e] = '\0';
          local_a8[0x2f] = '\0';
          local_a8[0x10] = '\0';
          local_a8[0x11] = '\0';
          local_a8[0x12] = '\0';
          local_a8[0x13] = '\0';
          local_a8[0x14] = '\0';
          local_a8[0x15] = '\0';
          local_a8[0x16] = '\0';
          local_a8[0x17] = '\0';
          local_a8[0x18] = '\0';
          local_a8[0x19] = '\0';
          local_a8[0x1a] = '\0';
          local_a8[0x1b] = '\0';
          local_a8[0x1c] = '\0';
          local_a8[0x1d] = '\0';
          local_a8[0x1e] = '\0';
          local_a8[0x1f] = '\0';
          local_a8[0] = '\0';
          local_a8[1] = '\0';
          local_a8[2] = '\0';
          local_a8[3] = '\0';
          local_a8[4] = '\0';
          local_a8[5] = '\0';
          local_a8[6] = '\0';
          local_a8[7] = '\0';
          local_a8[8] = '\0';
          local_a8[9] = '\0';
          local_a8[10] = '\0';
          local_a8[0xb] = '\0';
          local_a8[0xc] = '\0';
          local_a8[0xd] = '\0';
          local_a8[0xe] = '\0';
          local_a8[0xf] = '\0';
          local_a8[0x70] = '\0';
          local_a8[0x71] = '\0';
          local_a8[0x72] = '\0';
          local_a8[0x73] = '\0';
          local_a8[0x74] = '\0';
          local_a8[0x75] = '\0';
          local_a8[0x76] = '\0';
          local_a8[0x77] = '\0';
          do {
            if (poVar4 == (object_kind *)0x0) {
              pcVar5 = tval_find_name(pmVar12->tval);
              file_putf(fff,"drop-base:%s:%d:%d:%d\n",pcVar5,(ulong)pmVar12->percent_chance,
                        (ulong)pmVar12->min,(ulong)pmVar12->max);
            }
            else {
              object_short_name(local_a8,0x78,poVar4->name);
              uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
              pcVar5 = tval_find_name(poVar4->tval);
              in_stack_ffffffffffffff28 = (char *)CONCAT44(uVar18,pmVar12->max);
              file_putf(fff,"drop:%s:%s:%d:%d:%d\n",pcVar5,local_a8,(ulong)pmVar12->percent_chance,
                        (ulong)pmVar12->min,in_stack_ffffffffffffff28);
            }
            pmVar12 = pmVar12->next;
          } while (pmVar12 != (monster_drop *)0x0);
        }
        for (pmVar16 = pmVar7[uVar10].friends; pmVar16 != (monster_friends *)0x0;
            pmVar16 = pmVar16->next) {
          mVar1 = pmVar16->role;
          pcVar5 = "servant";
          if (mVar1 == MON_GROUP_SERVANT) {
LAB_0016e19d:
            pcVar5 = string_make(pcVar5);
LAB_0016e1aa:
            in_stack_ffffffffffffff28 = pcVar5;
            file_putf(fff,"friends:%d:%dd%d:%s:%s\n",(ulong)pmVar16->percent_chance,
                      (ulong)pmVar16->number_dice,(ulong)pmVar16->number_side,pmVar16->race->name,
                      pcVar5);
            string_free(pcVar5);
          }
          else {
            if (mVar1 == MON_GROUP_BODYGUARD) {
              pcVar5 = "bodyguard";
              goto LAB_0016e19d;
            }
            if (mVar1 != MON_GROUP_MEMBER) {
              pcVar5 = (char *)0x0;
              goto LAB_0016e1aa;
            }
            file_putf(fff,"friends:%d:%dd%d:%s\n",(ulong)pmVar16->percent_chance,
                      (ulong)pmVar16->number_dice,(ulong)pmVar16->number_side,pmVar16->race->name,
                      in_stack_ffffffffffffff28);
          }
        }
        for (pmVar17 = pmVar7[uVar10].friends_base; pmVar17 != (monster_friends_base *)0x0;
            pmVar17 = pmVar17->next) {
          mVar1 = pmVar17->role;
          pcVar5 = "servant";
          if (mVar1 == MON_GROUP_SERVANT) {
LAB_0016e234:
            pcVar5 = string_make(pcVar5);
LAB_0016e241:
            in_stack_ffffffffffffff28 = pcVar5;
            file_putf(fff,"friends-base:%d:%dd%d:%s:%s\n",(ulong)pmVar17->percent_chance,
                      (ulong)pmVar17->number_dice,(ulong)pmVar17->number_side,pmVar17->base->name,
                      pcVar5);
            string_free(pcVar5);
          }
          else {
            if (mVar1 == MON_GROUP_BODYGUARD) {
              pcVar5 = "bodyguard";
              goto LAB_0016e234;
            }
            if (mVar1 != MON_GROUP_MEMBER) {
              pcVar5 = (char *)0x0;
              goto LAB_0016e241;
            }
            file_putf(fff,"friends-base:%d:%dd%d:%s\n",(ulong)pmVar17->percent_chance,
                      (ulong)pmVar17->number_dice,(ulong)pmVar17->number_side,pmVar17->base->name,
                      in_stack_ffffffffffffff28);
          }
        }
        pmVar13 = pmVar7[uVar10].mimic_kinds;
        if (pmVar13 != (monster_mimic *)0x0) {
          poVar4 = pmVar13->kind;
          local_a8[0x60] = '\0';
          local_a8[0x61] = '\0';
          local_a8[0x62] = '\0';
          local_a8[99] = '\0';
          local_a8[100] = '\0';
          local_a8[0x65] = '\0';
          local_a8[0x66] = '\0';
          local_a8[0x67] = '\0';
          local_a8[0x68] = '\0';
          local_a8[0x69] = '\0';
          local_a8[0x6a] = '\0';
          local_a8[0x6b] = '\0';
          local_a8[0x6c] = '\0';
          local_a8[0x6d] = '\0';
          local_a8[0x6e] = '\0';
          local_a8[0x6f] = '\0';
          local_a8[0x50] = '\0';
          local_a8[0x51] = '\0';
          local_a8[0x52] = '\0';
          local_a8[0x53] = '\0';
          local_a8[0x54] = '\0';
          local_a8[0x55] = '\0';
          local_a8[0x56] = '\0';
          local_a8[0x57] = '\0';
          local_a8[0x58] = '\0';
          local_a8[0x59] = '\0';
          local_a8[0x5a] = '\0';
          local_a8[0x5b] = '\0';
          local_a8[0x5c] = '\0';
          local_a8[0x5d] = '\0';
          local_a8[0x5e] = '\0';
          local_a8[0x5f] = '\0';
          local_a8[0x40] = '\0';
          local_a8[0x41] = '\0';
          local_a8[0x42] = '\0';
          local_a8[0x43] = '\0';
          local_a8[0x44] = '\0';
          local_a8[0x45] = '\0';
          local_a8[0x46] = '\0';
          local_a8[0x47] = '\0';
          local_a8[0x48] = '\0';
          local_a8[0x49] = '\0';
          local_a8[0x4a] = '\0';
          local_a8[0x4b] = '\0';
          local_a8[0x4c] = '\0';
          local_a8[0x4d] = '\0';
          local_a8[0x4e] = '\0';
          local_a8[0x4f] = '\0';
          local_a8[0x30] = '\0';
          local_a8[0x31] = '\0';
          local_a8[0x32] = '\0';
          local_a8[0x33] = '\0';
          local_a8[0x34] = '\0';
          local_a8[0x35] = '\0';
          local_a8[0x36] = '\0';
          local_a8[0x37] = '\0';
          local_a8[0x38] = '\0';
          local_a8[0x39] = '\0';
          local_a8[0x3a] = '\0';
          local_a8[0x3b] = '\0';
          local_a8[0x3c] = '\0';
          local_a8[0x3d] = '\0';
          local_a8[0x3e] = '\0';
          local_a8[0x3f] = '\0';
          local_a8[0x20] = '\0';
          local_a8[0x21] = '\0';
          local_a8[0x22] = '\0';
          local_a8[0x23] = '\0';
          local_a8[0x24] = '\0';
          local_a8[0x25] = '\0';
          local_a8[0x26] = '\0';
          local_a8[0x27] = '\0';
          local_a8[0x28] = '\0';
          local_a8[0x29] = '\0';
          local_a8[0x2a] = '\0';
          local_a8[0x2b] = '\0';
          local_a8[0x2c] = '\0';
          local_a8[0x2d] = '\0';
          local_a8[0x2e] = '\0';
          local_a8[0x2f] = '\0';
          local_a8[0x10] = '\0';
          local_a8[0x11] = '\0';
          local_a8[0x12] = '\0';
          local_a8[0x13] = '\0';
          local_a8[0x14] = '\0';
          local_a8[0x15] = '\0';
          local_a8[0x16] = '\0';
          local_a8[0x17] = '\0';
          local_a8[0x18] = '\0';
          local_a8[0x19] = '\0';
          local_a8[0x1a] = '\0';
          local_a8[0x1b] = '\0';
          local_a8[0x1c] = '\0';
          local_a8[0x1d] = '\0';
          local_a8[0x1e] = '\0';
          local_a8[0x1f] = '\0';
          local_a8[0] = '\0';
          local_a8[1] = '\0';
          local_a8[2] = '\0';
          local_a8[3] = '\0';
          local_a8[4] = '\0';
          local_a8[5] = '\0';
          local_a8[6] = '\0';
          local_a8[7] = '\0';
          local_a8[8] = '\0';
          local_a8[9] = '\0';
          local_a8[10] = '\0';
          local_a8[0xb] = '\0';
          local_a8[0xc] = '\0';
          local_a8[0xd] = '\0';
          local_a8[0xe] = '\0';
          local_a8[0xf] = '\0';
          local_a8[0x70] = '\0';
          local_a8[0x71] = '\0';
          local_a8[0x72] = '\0';
          local_a8[0x73] = '\0';
          local_a8[0x74] = '\0';
          local_a8[0x75] = '\0';
          local_a8[0x76] = '\0';
          local_a8[0x77] = '\0';
          do {
            object_short_name(local_a8,0x78,poVar4->name);
            pcVar5 = tval_find_name(poVar4->tval);
            file_putf(fff,"mimic:%s:%s\n",pcVar5,local_a8);
            pmVar13 = pmVar13->next;
          } while (pmVar13 != (monster_mimic *)0x0);
        }
        file_putf(fff,"\n");
        paVar6 = z_info;
        pmVar7 = l_list;
        pmVar14 = r_info;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < paVar6->r_max);
  }
  return;
}

Assistant:

static void write_lore_entries(ang_file *fff)
{
	int i, n;

	for (i = 0; i < z_info->r_max; i++) {
		/* Current entry */
		struct monster_race *race = &r_info[i];
		struct monster_lore *lore = &l_list[i];

		/* Ignore non-existent or unseen monsters */
		if (!race->name) continue;
		if (!lore->sights && !lore->all_known) continue;

		/* Output 'name' */
		file_putf(fff, "name:%s\n", race->name);

		/* Output base if we're remembering everything */
		if (lore->all_known)
			file_putf(fff, "base:%s\n", race->base->name);

		/* Output counts */
		file_putf(fff, "counts:%d:%d:%d:%d:%d:%d:%d\n", lore->sights,
				  lore->deaths, lore->tkills, lore->wake, lore->ignore,
				  lore->cast_innate, lore->cast_spell);

		/* Output blow (up to max blows) */
		for (n = 0; n < z_info->mon_blows_max; n++) {
			/* End of blows */
			if (!lore->blow_known[n] && !lore->all_known) continue;
			if (!lore->blows[n].method) continue;

			/* Output blow method */
			file_putf(fff, "blow:%s", lore->blows[n].method->name);

			/* Output blow effect (may be none) */
			file_putf(fff, ":%s", lore->blows[n].effect->name);

			/* Output blow damage (may be 0) */
			file_putf(fff, ":%d+%dd%dM%d", lore->blows[n].dice.base,
					lore->blows[n].dice.dice,
					lore->blows[n].dice.sides,
					lore->blows[n].dice.m_bonus);

			/* Output number of times that blow has been seen */
			file_putf(fff, ":%d", lore->blows[n].times_seen);

			/* Output blow index */
			file_putf(fff, ":%d", n);

			/* End line */
			file_putf(fff, "\n");
		}

		/* Output flags */
		write_flags(fff, "flags:", lore->flags, RF_SIZE, r_info_flags);

		/* Output spell flags (multiple lines) */
		rsf_inter(lore->spell_flags, race->spell_flags);
		write_flags(fff, "spells:", lore->spell_flags, RSF_SIZE,
					r_info_spell_flags);

		/* Output 'drop' */
		if (lore->drops) {
			struct monster_drop *drop = lore->drops;
			struct object_kind *kind = drop->kind;
			char name[120] = "";

			while (drop) {
				if (kind) {
					object_short_name(name, sizeof name, kind->name);
					file_putf(fff, "drop:%s:%s:%d:%d:%d\n",
							  tval_find_name(kind->tval), name,
							  drop->percent_chance, drop->min, drop->max);
					drop = drop->next;
				} else {
					file_putf(fff, "drop-base:%s:%d:%d:%d\n",
							  tval_find_name(drop->tval), drop->percent_chance,
							  drop->min, drop->max);
					drop = drop->next;
				}
			}
		}

		/* Output 'friends' */
		if (lore->friends) {
			struct monster_friends *f = lore->friends;

			while (f) {
				if (f->role == MON_GROUP_MEMBER) {
					file_putf(fff, "friends:%d:%dd%d:%s\n", f->percent_chance,
							  f->number_dice, f->number_side, f->race->name);
				} else {
					char *role_name = NULL;
					if (f->role == MON_GROUP_SERVANT) {
						role_name = string_make("servant");
					} else if (f->role == MON_GROUP_BODYGUARD) {
						role_name = string_make("bodyguard");
					}
					file_putf(fff, "friends:%d:%dd%d:%s:%s\n",
							  f->percent_chance, f->number_dice,
							  f->number_side, f->race->name, role_name);
					string_free(role_name);
				}
				f = f->next;
			}
		}

		/* Output 'friends-base' */
		if (lore->friends_base) {
			struct monster_friends_base *b = lore->friends_base;

			while (b) {
				if (b->role == MON_GROUP_MEMBER) {
					file_putf(fff, "friends-base:%d:%dd%d:%s\n",
							  b->percent_chance, b->number_dice,
							  b->number_side, b->base->name);
				} else {
					char *role_name = NULL;
					if (b->role == MON_GROUP_SERVANT) {
						role_name = string_make("servant");
					} else if (b->role == MON_GROUP_BODYGUARD) {
						role_name = string_make("bodyguard");
					}
					file_putf(fff, "friends-base:%d:%dd%d:%s:%s\n",
							  b->percent_chance, b->number_dice,
							  b->number_side, b->base->name, role_name);
					string_free(role_name);
				}
				b = b->next;
			}
		}

		/* Output 'mimic' */
		if (lore->mimic_kinds) {
			struct monster_mimic *m = lore->mimic_kinds;
			struct object_kind *kind = m->kind;
			char name[120] = "";

			while (m) {
				object_short_name(name, sizeof name, kind->name);
				file_putf(fff, "mimic:%s:%s\n",
						  tval_find_name(kind->tval), name);
				m = m->next;
			}
		}

		file_putf(fff, "\n");
	}
}